

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_space_time_stack.cpp
# Opt level: O0

void __thiscall KokkosTools::SpaceTimeStack::State::end_kernel(State *this,uint64_t kernid)

{
  ostream *poVar1;
  string local_48;
  Impl local_28;
  StackNode *expect_node;
  Now end_time;
  uint64_t kernid_local;
  State *this_local;
  
  end_time.impl.__d.__r = (Impl)(Impl)kernid;
  expect_node = (StackNode *)now();
  local_28.__d.__r = (duration)(duration)end_time.impl.__d.__r;
  if (end_time.impl.__d.__r != (Impl)this->stack_frame) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"Expected \"");
    StackNode::get_full_name_abi_cxx11_(&local_48,this->stack_frame);
    poVar1 = std::operator<<(poVar1,(string *)&local_48);
    std::operator<<(poVar1,"\" to end, got different kernel ID\n");
    std::__cxx11::string::~string((string *)&local_48);
    abort();
  }
  end_frame(this,(Now)expect_node);
  return;
}

Assistant:

void end_kernel(std::uint64_t kernid) {
    auto end_time    = now();
    auto expect_node = reinterpret_cast<StackNode*>(kernid);
    if (expect_node != stack_frame) {
      std::cerr << "Expected \"" << stack_frame->get_full_name()
                << "\" to end, got different kernel ID\n";
      abort();
    }
    end_frame(end_time);
  }